

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_list.c
# Opt level: O3

int cmime_list_remove(CMimeList_T *list,CMimeListElem_T *elem,void **data)

{
  _CMimeListElem *p_Var1;
  _CMimeListElem *p_Var2;
  int iVar3;
  
  if (elem != (CMimeListElem_T *)0x0) {
    if (list->size == 0) {
      iVar3 = -1;
    }
    else {
      *data = elem->data;
      p_Var1 = elem->next;
      if (list->head == elem) {
        list->head = p_Var1;
        if (p_Var1 == (_CMimeListElem *)0x0) {
          list->tail = (CMimeListElem_T *)0x0;
        }
        else {
          p_Var1->prev = (_CMimeListElem *)0x0;
        }
      }
      else {
        p_Var2 = elem->prev;
        p_Var2->next = p_Var1;
        if (p_Var1 == (_CMimeListElem *)0x0) {
          list->tail = p_Var2;
        }
        else {
          p_Var1->prev = p_Var2;
        }
      }
      free(elem);
      list->size = list->size + -1;
      iVar3 = 0;
    }
    return iVar3;
  }
  if (list == (CMimeList_T *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_list.c"
                  ,0x41,"int cmime_list_remove(CMimeList_T *, CMimeListElem_T *, void **)");
  }
  __assert_fail("elem",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_list.c"
                ,0x42,"int cmime_list_remove(CMimeList_T *, CMimeListElem_T *, void **)");
}

Assistant:

int cmime_list_remove(CMimeList_T *list, CMimeListElem_T *elem, void **data) {
    /* no null element and no empty list */
    if(elem == NULL || cmime_list_size(list) == 0) {
        assert(list);
        assert(elem);
        return(-1);
    }
 
    *data = elem->data;
        
    /* handle removal of first element */
    if(elem == cmime_list_head(list)) {
        list->head = elem->next;
 
        if(list->head == NULL) {
            list->tail = NULL;
        } else {
            list->head->prev = NULL;
        }
    } else {
        elem->prev->next = elem->next;
 
        if(elem->next == NULL) {
            list->tail = elem->prev;
        } else {
            elem->next->prev = elem->prev;
        }
    }
 
    free(elem);
    list->size--;

    return(0);
}